

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_free_line(void)

{
  if (ngp_curline.line != (char *)0x0) {
    free(ngp_curline.line);
    ngp_curline.value._0_4_ = 0;
    ngp_curline._20_8_ = 0;
    ngp_curline.line = (char *)0x0;
    ngp_curline.name._0_4_ = 0;
    ngp_curline.name._4_4_ = 0;
    ngp_curline.comment = (char *)0x0;
    ngp_curline.format = 0;
    ngp_curline.flags = 0;
  }
  return 0;
}

Assistant:

int	ngp_free_line(void)
 {
   if (NULL != ngp_curline.line)
     { ngp_free(ngp_curline.line);
       ngp_curline.line = NULL;
       ngp_curline.name = NULL;
       ngp_curline.value = NULL;
       ngp_curline.comment = NULL;
       ngp_curline.type = NGP_TTYPE_UNKNOWN;
       ngp_curline.format = NGP_FORMAT_OK;
       ngp_curline.flags = 0;
     }
   return(NGP_OK);
 }